

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window)

{
  float *pfVar1;
  float fVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar6 = (window->Scroll).x;
  fVar7 = (window->Scroll).y;
  fVar5 = (window->ScrollTarget).x;
  if (fVar5 < 3.4028235e+38) {
    fVar6 = (window->ScrollTargetCenterRatio).x;
    fVar2 = (window->ScrollTargetEdgeSnapDist).x;
    if (0.0 < fVar2) {
      if (fVar5 <= fVar2) {
        fVar5 = fVar5 * fVar6 + 0.0;
      }
      else {
        fVar8 = (window->ScrollMax).x + (window->Size).x;
        if (fVar8 - fVar2 <= fVar5) {
          fVar5 = fVar5 + (fVar8 - fVar5) * fVar6;
        }
      }
    }
    fVar6 = fVar5 - fVar6 * ((window->SizeFull).x - (window->ScrollbarSizes).x);
  }
  pfVar1 = &(window->ScrollTarget).y;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    fVar8 = ImGuiWindow::TitleBarHeight(window);
    fVar4 = ImGuiWindow::MenuBarHeight(window);
    fVar7 = (window->ScrollTarget).y;
    fVar5 = (window->ScrollTargetCenterRatio).y;
    fVar2 = (window->ScrollTargetEdgeSnapDist).y;
    if (0.0 < fVar2) {
      if (fVar7 <= fVar2) {
        fVar7 = fVar7 * fVar5 + 0.0;
      }
      else {
        fVar9 = ((window->ScrollMax).y + (window->Size).y) - (fVar4 + fVar8);
        if (fVar9 - fVar2 <= fVar7) {
          fVar7 = fVar7 + (fVar9 - fVar7) * fVar5;
        }
      }
    }
    fVar7 = fVar7 - fVar5 * (((window->SizeFull).y - (window->ScrollbarSizes).y) - (fVar4 + fVar8));
  }
  fVar6 = (float)(int)(float)(-(uint)(0.0 <= fVar6) & (uint)fVar6);
  fVar5 = (float)(int)(float)(-(uint)(0.0 <= fVar7) & (uint)fVar7);
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    fVar7 = (window->ScrollMax).x;
    if (fVar7 <= fVar6) {
      fVar6 = fVar7;
    }
    fVar7 = (window->ScrollMax).y;
    if (fVar7 <= fVar5) {
      fVar5 = fVar7;
    }
  }
  IVar3.y = fVar5;
  IVar3.x = fVar6;
  return IVar3;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window)
{
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float center_x_ratio = window->ScrollTargetCenterRatio.x;
        float scroll_target_x = window->ScrollTarget.x;
        float snap_x_min = 0.0f;
        float snap_x_max = window->ScrollMax.x + window->Size.x;
        if (window->ScrollTargetEdgeSnapDist.x > 0.0f)
            scroll_target_x = CalcScrollEdgeSnap(scroll_target_x, snap_x_min, snap_x_max, window->ScrollTargetEdgeSnapDist.x, center_x_ratio);
        scroll.x = scroll_target_x - center_x_ratio * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float center_y_ratio = window->ScrollTargetCenterRatio.y;
        float scroll_target_y = window->ScrollTarget.y;
        float snap_y_min = 0.0f;
        float snap_y_max = window->ScrollMax.y + window->Size.y - decoration_up_height;
        if (window->ScrollTargetEdgeSnapDist.y > 0.0f)
            scroll_target_y = CalcScrollEdgeSnap(scroll_target_y, snap_y_min, snap_y_max, window->ScrollTargetEdgeSnapDist.y, center_y_ratio);
        scroll.y = scroll_target_y - center_y_ratio * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}